

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O3

void __thiscall
sjtu::TrainManager::query_transfer_cmp<sjtu::cmp_time>
          (TrainManager *this,long *station,timeType *date)

{
  uint uVar1;
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *pBVar2;
  char *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  pair<unsigned_int,_bool> pVar8;
  pair<unsigned_int,_bool> pVar9;
  long *plVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar11;
  trainType *ptVar12;
  recordType *prVar13;
  undefined4 extraout_var_02;
  ostream *poVar14;
  long *plVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  char *__s;
  locType offset;
  pair<sjtu::recordType,_sjtu::recordType> ans;
  uint bits [3] [512];
  cmp_time local_1b79;
  trainType *local_1b78;
  long *local_1b70;
  timeType *local_1b68;
  ulong local_1b60;
  long local_1b58;
  ulong local_1b50;
  recordType *local_1b48;
  timeType local_1b40;
  long local_1b30;
  int local_1b24;
  timeType *local_1b20;
  recordType *local_1b18;
  long *local_1b10;
  long local_1b08;
  long local_1b00 [2];
  string local_1af0;
  ulong local_1ad0;
  long *local_1ac8;
  long local_1ac0;
  long *local_1ab8;
  long local_1ab0;
  long local_1aa8 [2];
  long *local_1a98;
  long local_1a90;
  long local_1a88 [2];
  undefined1 local_1a78 [64];
  undefined1 local_1a38 [8];
  char *local_1a30;
  ulong local_1a18;
  int iStack_1a10;
  int iStack_1a0c;
  ulong local_1a08 [2];
  undefined8 local_19f8;
  int local_19f0;
  undefined1 local_19e8 [64];
  string local_19a8 [32];
  ulong local_1988;
  int iStack_1980;
  int iStack_197c;
  _Alloc_hider a_Stack_1968 [2];
  pair<sjtu::recordType,_sjtu::recordType> local_1958;
  ulong local_1838 [256];
  uint local_1038 [512];
  uint local_838 [514];
  undefined4 extraout_var_01;
  
  pBVar2 = this->StationBpTree;
  local_1b70 = station;
  local_1b20 = date;
  local_1a98 = local_1a88;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1a98,*station,station[1] + *station);
  if (local_1a90 == 0) {
    local_1838[0] = 0;
  }
  else {
    lVar18 = 0;
    lVar16 = 0;
    local_1838[0] = 0;
    do {
      lVar16 = ((long)*(char *)((long)local_1a98 + lVar18) + lVar16 * 0x239 + 0x100) % 0x3b800001;
      local_1838[0] =
           (long)((long)*(char *)((long)local_1a98 + lVar18) + local_1838[0] * 0x301 + 0x100) %
           0x3b9aca07;
      lVar18 = lVar18 + 1;
    } while (local_1a90 != lVar18);
    local_1838[0] = lVar16 << 0x20 | local_1838[0];
  }
  pVar8 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
                    (pBVar2,local_1838);
  if (local_1a98 != local_1a88) {
    operator_delete(local_1a98,local_1a88[0] + 1);
  }
  pBVar2 = this->StationBpTree;
  local_1ab8 = local_1aa8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1ab8,local_1b70[4],local_1b70[5] + local_1b70[4]);
  if (local_1ab0 == 0) {
    local_1838[0] = 0;
  }
  else {
    lVar18 = 0;
    lVar16 = 0;
    local_1838[0] = 0;
    do {
      lVar16 = ((long)*(char *)((long)local_1ab8 + lVar18) + lVar16 * 0x239 + 0x100) % 0x3b800001;
      local_1838[0] =
           (long)((long)*(char *)((long)local_1ab8 + lVar18) + local_1838[0] * 0x301 + 0x100) %
           0x3b9aca07;
      lVar18 = lVar18 + 1;
    } while (local_1ab0 != lVar18);
    local_1838[0] = lVar16 << 0x20 | local_1838[0];
  }
  pVar9 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
                    (pBVar2,local_1838);
  if (local_1ab8 != local_1aa8) {
    operator_delete(local_1ab8,local_1aa8[0] + 1);
  }
  if (((ulong)pVar9 >> 0x20 & 1) == 0 || ((ulong)pVar8 >> 0x20 & 1) == 0) {
    plVar10 = (long *)std::ostream::operator<<((ostream *)&std::cout,0);
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
  }
  else {
    local_1ac8 = local_1b70 + 4;
    bitset_query(this,pVar8.first,(uint *)local_1838);
    bitset_query(this,pVar9.first,local_1038);
    std::pair<sjtu::recordType,_sjtu::recordType>::pair<sjtu::recordType,_sjtu::recordType,_true>
              (&local_1958);
    local_1b48 = (recordType *)local_19e8;
    local_1b18 = &local_1958.second;
    lVar16 = 0;
    local_1b50 = 0;
    do {
      uVar20 = *(uint *)((long)local_1838 + lVar16 * 4);
      if (uVar20 != 0) {
        local_1b24 = (int)lVar16 * 0x20 + 1;
        local_1ac0 = lVar16;
        do {
          uVar17 = -uVar20 & uVar20;
          uVar21 = uVar20;
          if (uVar17 != 0) {
            iVar6 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
              }
            }
            local_1b30 = (long)(iVar6 + local_1b24) * 0xa7a8;
            iVar6 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>).
                      _vptr_FileManager_Base[2])(this->TrainFile,&local_1b30);
            local_1b78 = (trainType *)CONCAT44(extraout_var,iVar6);
            local_1b68 = local_1b78->saleDate;
            iVar6 = timeType::dateminus(local_1b20,local_1b68);
            local_1af0._M_dataplus._M_p = (pointer)&local_1af0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1af0,*local_1b70,local_1b70[1] + *local_1b70);
            iVar7 = trainType::get_Delta_date(local_1b78,&local_1af0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1af0._M_dataplus._M_p != &local_1af0.field_2) {
              operator_delete(local_1af0._M_dataplus._M_p,
                              local_1af0.field_2._M_allocated_capacity + 1);
            }
            uVar20 = iVar7 + iVar6;
            if (-1 < (int)uVar20 && local_1b78->is_released != false) {
              iVar6 = timeType::dateminus(local_1b78->saleDate + 1,local_1b68);
              if ((int)uVar20 <= iVar6) {
                std::pair<sjtu::recordType,_sjtu::recordType>::
                pair<sjtu::recordType,_sjtu::recordType,_true>
                          ((pair<sjtu::recordType,_sjtu::recordType> *)local_1a78);
                ptVar12 = local_1b78;
                local_1b68 = (timeType *)local_1a78._8_8_;
                strlen(local_1b78->trainID);
                std::__cxx11::string::_M_replace
                          ((ulong)local_1a78,0,(char *)local_1b68,(ulong)ptVar12);
                std::__cxx11::string::_M_assign((string *)(local_1a78 + 0x20));
                local_1a08[0]._0_4_ = (ptVar12->startTime).month;
                local_1a08[0]._4_4_ = (ptVar12->startTime).day;
                local_1a08[1]._0_4_ = (ptVar12->startTime).hour;
                local_1a08[1]._4_4_ = (ptVar12->startTime).minute;
                local_1a18._0_4_ = (ptVar12->startTime).month;
                local_1a18._4_4_ = (ptVar12->startTime).day;
                iStack_1a10 = (ptVar12->startTime).hour;
                iStack_1a0c = (ptVar12->startTime).minute;
                local_19f8._0_4_ = 0;
                local_19f8._4_4_ = 100000;
                local_19f0 = 0;
                if (0 < ptVar12->stationNum) {
                  local_1ad0 = (ulong)uVar20;
                  lVar18 = 0;
                  local_1b60 = 0;
                  do {
                    local_1b58 = lVar18;
                    iVar6 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>).
                              _vptr_FileManager_Base[2])();
                    if (local_1b58 != 0) {
                      lVar18 = local_1b58 * 0x1a8;
                      timeType::operator+(&local_1b40,(int *)local_1a08);
                      local_1a08[0]._0_4_ = local_1b40.month;
                      local_1a08[0]._4_4_ = local_1b40.day;
                      local_1a08[1]._0_4_ = local_1b40.hour;
                      local_1a08[1]._4_4_ = local_1b40.minute;
                      local_19f0 = local_19f0 +
                                   (uint)((byte)local_1b60 & 1) *
                                   *(int *)(lVar18 + CONCAT44(extraout_var_00,iVar6) + 0x1c4);
                    }
                    pcVar3 = local_1a30;
                    if ((local_1b60 & 1) != 0) {
                      lVar18 = local_1b58 * 0x1a8 + CONCAT44(extraout_var_00,iVar6);
                      __s = (char *)(lVar18 + 0x20);
                      strlen(__s);
                      std::__cxx11::string::_M_replace((ulong)local_1a38,0,pcVar3,(ulong)__s);
                      iVar6 = *(int *)(lVar18 + 0x4c + local_1ad0 * 4);
                      if (local_19f8._4_4_ < iVar6) {
                        iVar6 = local_19f8._4_4_;
                      }
                      local_19f8._4_4_ = iVar6;
                      local_19f8._0_4_ = (int)local_19f8 + *(int *)(lVar18 + 0x1bc);
                      pBVar2 = this->StationBpTree;
                      local_1b10 = local_1b00;
                      sVar11 = strlen(__s);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_1b10,__s,__s + sVar11);
                      if (local_1b08 == 0) {
                        local_1b40._0_8_ = 0;
                      }
                      else {
                        lVar19 = 0;
                        lVar18 = 0;
                        local_1b40._0_8_ = 0;
                        do {
                          lVar18 = ((long)*(char *)((long)local_1b10 + lVar19) + lVar18 * 0x239 +
                                   0x100) % 0x3b800001;
                          local_1b40._0_8_ =
                               ((long)*(char *)((long)local_1b10 + lVar19) +
                                local_1b40._0_8_ * 0x301 + 0x100) % 0x3b9aca07;
                          lVar19 = lVar19 + 1;
                        } while (local_1b08 != lVar19);
                        local_1b40._0_8_ = lVar18 << 0x20 | local_1b40._0_8_;
                      }
                      pVar8 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>
                              ::find(pBVar2,(unsigned_long_long *)&local_1b40);
                      bitset_query(this,pVar8.first,local_838);
                      if (local_1b10 != local_1b00) {
                        operator_delete(local_1b10,local_1b00[0] + 1);
                      }
                      ptVar12 = (trainType *)0x0;
                      do {
                        uVar20 = local_838[(long)ptVar12] & local_1038[(long)ptVar12];
                        local_838[(long)ptVar12] = uVar20;
                        local_1b78 = ptVar12;
                        if (uVar20 != 0) {
                          local_1b68 = (timeType *)
                                       CONCAT44(local_1b68._4_4_,(int)ptVar12 * 0x20 + 1);
                          do {
                            uVar21 = -uVar20 & uVar20;
                            if (uVar21 != 0) {
                              iVar6 = 0;
                              if (uVar20 != 0) {
                                for (; (uVar20 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
                                }
                              }
                              local_1b40._0_8_ = (long)(iVar6 + (int)local_1b68) * 0xa7a8;
                              iVar6 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>).
                                        _vptr_FileManager_Base[2])(this->TrainFile,&local_1b40);
                              ptVar12 = (trainType *)CONCAT44(extraout_var_01,iVar6);
                              iVar6 = std::__cxx11::string::compare((char *)local_1a78);
                              if (iVar6 != 0) {
                                std::__cxx11::string::_M_assign((string *)(local_19e8 + 0x20));
                                std::__cxx11::string::_M_assign(local_19a8);
                                uVar4 = local_19e8._8_8_;
                                strlen((char *)ptVar12);
                                lVar16 = local_1ac0;
                                std::__cxx11::string::_M_replace
                                          ((ulong)local_1b48,0,(char *)uVar4,(ulong)ptVar12);
                                local_1988 = local_1a08[0];
                                iStack_1980 = (int)local_1a08[1];
                                iStack_197c = local_1a08[1]._4_4_;
                                bVar5 = trainType::getrecord(ptVar12,local_1b48,true);
                                if (bVar5) {
                                  if ((local_1b50 & 1) != 0) {
                                    bVar5 = cmp_time::operator()
                                                      (&local_1b79,
                                                       (pair<sjtu::recordType,_sjtu::recordType> *)
                                                       local_1a78,&local_1958);
                                    if (!bVar5) goto LAB_00110c1f;
                                  }
                                  prVar13 = recordType::operator=
                                                      (&local_1958.first,(recordType *)local_1a78);
                                  local_1b50 = CONCAT71((int7)((ulong)prVar13 >> 8),1);
                                  recordType::operator=(local_1b18,local_1b48);
                                }
                              }
                            }
LAB_00110c1f:
                            uVar1 = local_838[(long)local_1b78];
                            uVar20 = uVar1 ^ uVar21;
                            local_838[(long)local_1b78] = uVar20;
                          } while (uVar1 != uVar21);
                        }
                        ptVar12 = (trainType *)(local_1b78->trainID + 1);
                      } while (ptVar12 != (trainType *)0x200);
                    }
                    iVar6 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>).
                              _vptr_FileManager_Base[2])(this->TrainFile,&local_1b30);
                    if (local_1b58 != 0) {
                      lVar18 = local_1b58 * 0x1a8;
                      timeType::operator+(&local_1b40,(int *)local_1a08);
                      local_1a08[0]._0_4_ = local_1b40.month;
                      local_1a08[0]._4_4_ = local_1b40.day;
                      local_1a08[1]._0_4_ = local_1b40.hour;
                      local_1a08[1]._4_4_ = local_1b40.minute;
                      local_19f0 = local_19f0 +
                                   (uint)((byte)local_1b60 & 1) *
                                   *(int *)(lVar18 + CONCAT44(extraout_var_02,iVar6) + 0x1c0);
                    }
                    lVar18 = local_1b58;
                    iVar7 = std::__cxx11::string::compare((char *)local_1b70);
                    if (iVar7 == 0) {
                      local_1a08[0]._0_4_ = local_1b20->month;
                      local_1a08[0]._4_4_ = local_1b20->day;
                      local_1a18 = local_1a08[0];
                      iStack_1a10 = (int)local_1a08[1];
                      iStack_1a0c = local_1a08[1]._4_4_;
                      local_1b60 = CONCAT71((int7)(local_1a08[0] >> 8),1);
                    }
                    lVar18 = lVar18 + 1;
                  } while (lVar18 < *(int *)(CONCAT44(extraout_var_02,iVar6) + 0x18));
                }
                lVar18 = 0xe0;
                do {
                  if ((long *)(local_1a78 + lVar18) != *(long **)((long)local_1a88 + lVar18)) {
                    operator_delete(*(long **)((long)local_1a88 + lVar18),
                                    *(long *)(local_1a78 + lVar18) + 1);
                  }
                  lVar18 = lVar18 + -0x20;
                } while (lVar18 != 0xa0);
                if ((undefined1 *)local_19e8._0_8_ != local_19e8 + 0x10) {
                  operator_delete((void *)local_19e8._0_8_,local_19e8._16_8_ + 1);
                }
                lVar18 = 0x50;
                do {
                  if ((long *)(local_1a78 + lVar18) != *(long **)((long)local_1a88 + lVar18)) {
                    operator_delete(*(long **)((long)local_1a88 + lVar18),
                                    *(long *)(local_1a78 + lVar18) + 1);
                  }
                  lVar18 = lVar18 + -0x20;
                } while (lVar18 != 0x10);
                if ((undefined1 *)local_1a78._0_8_ != local_1a78 + 0x10) {
                  operator_delete((void *)local_1a78._0_8_,local_1a78._16_8_ + 1);
                }
              }
            }
            uVar21 = *(uint *)((long)local_1838 + lVar16 * 4);
          }
          uVar20 = uVar21 ^ uVar17;
          *(uint *)((long)local_1838 + lVar16 * 4) = uVar20;
        } while (uVar21 != uVar17);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 != 0x200);
    if ((local_1b50 & 1) == 0) {
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    }
    else {
      poVar14 = operator<<((ostream *)&std::cout,&local_1958.first);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      poVar14 = (ostream *)std::ostream::flush();
      poVar14 = operator<<(poVar14,local_1b18);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    }
    std::ostream::put((char)poVar14);
    std::ostream::flush();
    lVar16 = 0xe0;
    do {
      plVar15 = (long *)((long)&(((recordType *)(local_1958.first.station + -1))->trainID).
                                _M_dataplus._M_p + lVar16);
      plVar10 = *(long **)((long)&a_Stack_1968[0]._M_p + lVar16);
      if (plVar15 != plVar10) {
        operator_delete(plVar10,*plVar15 + 1);
      }
      lVar16 = lVar16 + -0x20;
    } while (lVar16 != 0xa0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1958.second.trainID._M_dataplus._M_p != &local_1958.second.trainID.field_2) {
      operator_delete(local_1958.second.trainID._M_dataplus._M_p,
                      local_1958.second.trainID.field_2._M_allocated_capacity + 1);
    }
    lVar16 = 0x50;
    do {
      plVar15 = (long *)((long)&(((recordType *)(local_1958.first.station + -1))->trainID).
                                _M_dataplus._M_p + lVar16);
      plVar10 = *(long **)((long)&a_Stack_1968[0]._M_p + lVar16);
      if (plVar15 != plVar10) {
        operator_delete(plVar10,*plVar15 + 1);
      }
      lVar16 = lVar16 + -0x20;
    } while (lVar16 != 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1958.first.trainID._M_dataplus._M_p != &local_1958.first.trainID.field_2) {
      operator_delete(local_1958.first.trainID._M_dataplus._M_p,
                      local_1958.first.trainID.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void query_transfer_cmp(std::string station[] , timeType date , Compare comp)
		{
			auto ret_s = StationBpTree -> find(hasher(station[0])) , ret_t = StationBpTree -> find(hasher(station[1]));
			if (ret_s.second == false || ret_t.second == false) std::cout << 0 << std::endl;
			else
			{
				unsigned int bits[3][WS];		
				bitset_query(ret_s.first , bits[0]) , bitset_query(ret_t.first , bits[1]);
				std::pair<recordType , recordType> ans;bool found = false;
				for (int i = 0;i < WS;++ i)
					for (unsigned int w;bits[0][i];bits[0][i] ^= w)
					{
						w = bits[0][i] & (-bits[0][i]);
						if (!w) continue;
						int id = -1;
						for (unsigned int w_ = w;w_;w_ >>= 1) ++ id;
						locType offset = (i * W + id + 1) * sizeof (DynamicFileManager<trainType>::valueType);
						trainType *train = TrainFile -> read(offset);
						int day_id = timeType::dateminus(date , train -> saleDate[0]) + train -> get_Delta_date(station[0]);
						if (train -> is_released == false || day_id < 0 || day_id > timeType::dateminus(train -> saleDate[1] , train -> saleDate[0])) continue;
						std::pair<recordType , recordType> cur;
						cur.first.trainID = train -> trainID , cur.first.station[0] = station[0] , cur.first.time[0] = cur.first.time[1] = train -> startTime;
						cur.first.seat = 100000 , cur.first.price = 0 , cur.first.duration = 0;
						bool flag = false;
						for (int j = 0 , stationNum = train -> stationNum;j < train -> stationNum;++ j)
						{
							train = TrainFile -> read(offset);
							if (j) cur.first.time[1] = cur.first.time[1] + train -> stations[j].travelTime , cur.first.duration += flag * (train -> stations[j].travelTime);
							if (flag)
							{
								cur.first.station[1] = train -> stations[j].stationName;
								cur.first.seat = min(cur.first.seat , train -> stations[j].seatNum[day_id]) , cur.first.price += train -> stations[j].price;
								bitset_query(StationBpTree -> find(hasher(train -> stations[j].stationName)).first , bits[2]);
								for (int k = 0;k < WS;++ k)
								{
									bits[2][k] &= bits[1][k];
									for (unsigned int v;bits[2][k];bits[2][k] ^= v)
									{
										v = bits[2][k] & (-bits[2][k]);
										if (!v) continue;
										int id_ = -1;
										for (unsigned int v_ = v;v_;v_ >>= 1) ++ id_;
										trainType *train_ = TrainFile -> read((k * W + id_ + 1) * sizeof (DynamicFileManager<trainType>::valueType));
										if (train_ -> trainID == cur.first.trainID) continue;
										cur.second.station[0] = cur.first.station[1] , cur.second.station[1] = station[1];
										cur.second.trainID = train_ -> trainID , cur.second.time[0] = cur.first.time[1];
										if (train_ -> getrecord(&cur.second , true)) if (!found || comp(cur , ans)) ans = cur , found = true;
									}
								}
							}
							train = TrainFile -> read(offset);
							if (j) cur.first.time[1] = cur.first.time[1] + train -> stations[j].stopoverTime , cur.first.duration += flag * (train -> stations[j].stopoverTime);
							if (train -> stations[j].stationName == station[0])
							{
								flag = true;
								cur.first.time[1].month = cur.first.time[0].month = date.month;
								cur.first.time[0].hour = cur.first.time[1].hour , cur.first.time[0].minute = cur.first.time[1].minute;
								cur.first.time[1].day = cur.first.time[0].day = date.day;
							}
						}
					}
				if (!found) std::cout << 0 << std::endl;
				else std::cout << ans.first << std::endl << ans.second << std::endl;
			}
		}